

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

QArrayDataPointer<char16_t> * __thiscall
QArrayDataPointer<char16_t>::sliced
          (QArrayDataPointer<char16_t> *__return_storage_ptr__,QArrayDataPointer<char16_t> *this,
          qsizetype pos,qsizetype n)

{
  if ((this->d == (Data *)0x0) ||
     (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    sliced(__return_storage_ptr__,this,pos,n);
  }
  else {
    this->ptr = this->ptr + pos;
    this->size = n;
    QArrayDataPointer(__return_storage_ptr__,this);
  }
  return __return_storage_ptr__;
}

Assistant:

QArrayDataPointer sliced(qsizetype pos, qsizetype n) &&
    {
        if (needsDetach())
            return sliced(pos, n);
        T *newBeginning = begin() + pos;
        std::destroy(begin(), newBeginning);
        std::destroy(newBeginning + n, end());
        setBegin(newBeginning);
        size = n;
        return std::move(*this);
    }